

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O1

Class * __thiscall
cppgenerate::Class::addSystemIncludes
          (Class *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includeFiles)

{
  long *plVar1;
  long *plVar2;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  plVar2 = *(long **)includeFiles;
  plVar1 = *(long **)(includeFiles + 8);
  if (plVar2 != plVar1) {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,*plVar2,plVar2[1] + *plVar2);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->m_systemIncludes,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      plVar2 = plVar2 + 4;
    } while (plVar2 != plVar1);
  }
  return this;
}

Assistant:

Class& Class::addSystemIncludes( std::vector<std::string> includeFiles ){
    for( std::string str : includeFiles ){
        m_systemIncludes.insert( str );
    }
        
    return *this;
}